

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_Alloc(CLzmaEnc *p,UInt32 keepWindowSize,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  int iVar1;
  uint uVar2;
  UInt16 *pUVar3;
  uint lclp;
  Bool btMode;
  UInt32 beforeSize;
  ISzAlloc *allocBig_local;
  ISzAlloc *alloc_local;
  UInt32 keepWindowSize_local;
  CLzmaEnc *p_local;
  
  lclp = 0x1000;
  iVar1 = RangeEnc_Alloc(&p->rc,alloc);
  if (iVar1 == 0) {
    p_local._4_4_ = 2;
  }
  else {
    uVar2 = p->lc + p->lp;
    if (((p->litProbs == (UInt16 *)0x0) || ((p->saveState).litProbs == (UInt16 *)0x0)) ||
       (p->lclp != uVar2)) {
      LzmaEnc_FreeLits(p,alloc);
      pUVar3 = (UInt16 *)(*alloc->Alloc)(alloc,(long)(0x300 << ((byte)uVar2 & 0x1f)) << 1);
      p->litProbs = pUVar3;
      pUVar3 = (UInt16 *)(*alloc->Alloc)(alloc,(long)(0x300 << ((byte)uVar2 & 0x1f)) << 1);
      (p->saveState).litProbs = pUVar3;
      if ((p->litProbs == (UInt16 *)0x0) || ((p->saveState).litProbs == (UInt16 *)0x0)) {
        LzmaEnc_FreeLits(p,alloc);
        return 2;
      }
      p->lclp = uVar2;
    }
    (p->matchFinderBase).bigHash = (uint)(0x1000000 < p->dictSize);
    if (p->dictSize + 0x1000 < keepWindowSize) {
      lclp = keepWindowSize - p->dictSize;
    }
    iVar1 = MatchFinder_Create(&p->matchFinderBase,p->dictSize,lclp,p->numFastBytes,0x111,allocBig);
    if (iVar1 == 0) {
      p_local._4_4_ = 2;
    }
    else {
      p->matchFinderObj = &p->matchFinderBase;
      MatchFinder_CreateVTable(&p->matchFinderBase,&p->matchFinder);
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static SRes LzmaEnc_Alloc(CLzmaEnc* p, UInt32 keepWindowSize, ISzAlloc* alloc, ISzAlloc* allocBig) {
  UInt32 beforeSize = kNumOpts;
  Bool btMode;
  if (!RangeEnc_Alloc(&p->rc, alloc))
    return SZ_ERROR_MEM;
  btMode = (p->matchFinderBase.btMode != 0);
#ifdef COMPRESS_MF_MT
  p->mtMode = (p->multiThread && !p->fastMode && btMode);
#endif

  {
    unsigned lclp = p->lc + p->lp;
    if (p->litProbs == 0 || p->saveState.litProbs == 0 || p->lclp != lclp) {
      LzmaEnc_FreeLits(p, alloc);
      p->litProbs = (CLzmaProb*)alloc->Alloc(alloc, (0x300 << lclp) * sizeof(CLzmaProb));
      p->saveState.litProbs = (CLzmaProb*)alloc->Alloc(alloc, (0x300 << lclp) * sizeof(CLzmaProb));
      if (p->litProbs == 0 || p->saveState.litProbs == 0) {
        LzmaEnc_FreeLits(p, alloc);
        return SZ_ERROR_MEM;
      }
      p->lclp = lclp;
    }
  }

  p->matchFinderBase.bigHash = (p->dictSize > kBigHashDicLimit);

  if (beforeSize + p->dictSize < keepWindowSize)
    beforeSize = keepWindowSize - p->dictSize;

#ifdef COMPRESS_MF_MT
  if (p->mtMode) {
    RINOK(MatchFinderMt_Create(&p->matchFinderMt, p->dictSize, beforeSize, p->numFastBytes, LZMA_MATCH_LEN_MAX, allocBig));
    p->matchFinderObj = &p->matchFinderMt;
    MatchFinderMt_CreateVTable(&p->matchFinderMt, &p->matchFinder);
  } else
#endif
  {
    if (!MatchFinder_Create(&p->matchFinderBase, p->dictSize, beforeSize, p->numFastBytes, LZMA_MATCH_LEN_MAX, allocBig))
      return SZ_ERROR_MEM;
    p->matchFinderObj = &p->matchFinderBase;
    MatchFinder_CreateVTable(&p->matchFinderBase, &p->matchFinder);
  }
  return SZ_OK;
}